

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc_test.c
# Opt level: O3

int LowMC_test_vector_255_255_4_1(void)

{
  int iVar1;
  uint8_t ciphertext_expected [32];
  uint8_t plaintext [32];
  uint8_t key [32];
  uint8_t local_68 [104];
  
  local_68[0x40] = 0x80;
  local_68[0x41] = '\0';
  local_68[0x42] = '\0';
  local_68[0x43] = '\0';
  local_68[0x44] = '\0';
  local_68[0x45] = '\0';
  local_68[0x46] = '\0';
  local_68[0x47] = '\0';
  local_68[0x48] = '\0';
  local_68[0x49] = '\0';
  local_68[0x4a] = '\0';
  local_68[0x4b] = '\0';
  local_68[0x4c] = '\0';
  local_68[0x4d] = '\0';
  local_68[0x4e] = '\0';
  local_68[0x4f] = '\0';
  local_68[0x50] = '\0';
  local_68[0x51] = '\0';
  local_68[0x52] = '\0';
  local_68[0x53] = '\0';
  local_68[0x54] = '\0';
  local_68[0x55] = '\0';
  local_68[0x56] = '\0';
  local_68[0x57] = '\0';
  local_68[0x58] = '\0';
  local_68[0x59] = '\0';
  local_68[0x5a] = '\0';
  local_68[0x5b] = '\0';
  local_68[0x5c] = '\0';
  local_68[0x5d] = '\0';
  local_68[0x5e] = '\0';
  local_68[0x5f] = '\0';
  local_68[0x20] = 0xab;
  local_68[0x21] = 0xff;
  local_68[0x22] = '\0';
  local_68[0x23] = '\0';
  local_68[0x24] = '\0';
  local_68[0x25] = '\0';
  local_68[0x26] = '\0';
  local_68[0x27] = '\0';
  local_68[0x28] = '\0';
  local_68[0x29] = '\0';
  local_68[0x2a] = '\0';
  local_68[0x2b] = '\0';
  local_68[0x2c] = '\0';
  local_68[0x2d] = '\0';
  local_68[0x2e] = '\0';
  local_68[0x2f] = '\0';
  local_68[0x30] = '\0';
  local_68[0x31] = '\0';
  local_68[0x32] = '\0';
  local_68[0x33] = '\0';
  local_68[0x34] = '\0';
  local_68[0x35] = '\0';
  local_68[0x36] = '\0';
  local_68[0x37] = '\0';
  local_68[0x38] = '\0';
  local_68[0x39] = '\0';
  local_68[0x3a] = '\0';
  local_68[0x3b] = '\0';
  local_68[0x3c] = '\0';
  local_68[0x3d] = '\0';
  local_68[0x3e] = '\0';
  local_68[0x3f] = '\0';
  local_68[0] = 0xd4;
  local_68[1] = 'r';
  local_68[2] = '\x1d';
  local_68[3] = 0x84;
  local_68[4] = 'm';
  local_68[5] = 0xd1;
  local_68[6] = 'M';
  local_68[7] = 0xba;
  local_68[8] = ':';
  local_68[9] = ',';
  local_68[10] = 'A';
  local_68[0xb] = 'P';
  local_68[0xc] = '\x1c';
  local_68[0xd] = '\x02';
  local_68[0xe] = 0xda;
  local_68[0xf] = '(';
  local_68[0x10] = '.';
  local_68[0x11] = 0xca;
  local_68[0x12] = 0xfd;
  local_68[0x13] = 'r';
  local_68[0x14] = 0xdf;
  local_68[0x15] = 'w';
  local_68[0x16] = 0x99;
  local_68[0x17] = '/';
  local_68[0x18] = '9';
  local_68[0x19] = 'g';
  local_68[0x1a] = 0xef;
  local_68[0x1b] = 0xd6;
  local_68[0x1c] = 0xe8;
  local_68[0x1d] = 0xf3;
  local_68[0x1e] = 0xf3;
  local_68[0x1f] = 'V';
  iVar1 = lowmc_enc(&parameters_255_255_4,local_68 + 0x40,local_68 + 0x20,local_68);
  return iVar1;
}

Assistant:

static int LowMC_test_vector_255_255_4_1(void) {
  const uint8_t key[32] = {
      0x80, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0,
      0x0,  0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0,
  };
  const uint8_t plaintext[32] = {
      0xab, 0xff, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0,
      0x0,  0x0,  0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0,
  };
  const uint8_t ciphertext_expected[32] = {
      0xd4, 0x72, 0x1d, 0x84, 0x6d, 0xd1, 0x4d, 0xba, 0x3a, 0x2c, 0x41,
      0x50, 0x1c, 0x2,  0xda, 0x28, 0x2e, 0xca, 0xfd, 0x72, 0xdf, 0x77,
      0x99, 0x2f, 0x39, 0x67, 0xef, 0xd6, 0xe8, 0xf3, 0xf3, 0x56,
  };

  return lowmc_enc(&parameters_255_255_4, key, plaintext, ciphertext_expected);
}